

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkLAW.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<6>::DefinedElsewhere::checkLAW(int law)

{
  undefined8 *puVar1;
  char *unaff_RBX;
  
  if ((law + 0xfU < 0xc) && ((0xc03U >> (law + 0xfU & 0x1f) & 1) != 0)) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  tools::Log::info<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,int>("LANG value: {}",law);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
checkLAW( int law ) {

  if ( ( law != -4 ) and ( law != -5 ) and
       ( law != -14 ) and ( law != -15 ) ) {

    Log::error( "Encountered illegal negative LAW value" );
    Log::info( "LANG must be equal to -4, -5, -14 or -15" );
    Log::info( "LANG value: {}", law );
    throw std::exception();
  }
}